

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

bool google::SendEmailInternal(char *dest,char *subject,char *body,bool use_logging)

{
  FILE *__stream;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  FILE *__s;
  size_t __n;
  uint *puVar4;
  int err;
  int err_00;
  byte bVar5;
  allocator<char> local_132;
  allocator<char> local_131;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string cmd;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((dest != (char *)0x0) && (*dest != '\0')) {
    if (use_logging) {
      if (0 < *SendEmailInternal::vlocal__) {
        if (SendEmailInternal::vlocal__ == &kLogSiteUninitialized) {
          bVar1 = InitVLOG3__(&SendEmailInternal::vlocal__,&fLI::FLAGS_v,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                              ,1);
          if (!bVar1) goto LAB_00112a39;
        }
        LogMessage::LogMessage
                  ((LogMessage *)&cmd,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                   ,0x722);
        poVar3 = std::operator<<((ostream *)(cmd._M_string_length + 0x7538),"Trying to send TITLE:")
        ;
        poVar3 = std::operator<<(poVar3,subject);
        poVar3 = std::operator<<(poVar3," BODY:");
        poVar3 = std::operator<<(poVar3,body);
        poVar3 = std::operator<<(poVar3," to ");
        std::operator<<(poVar3,dest);
        LogMessage::~LogMessage((LogMessage *)&cmd);
      }
    }
    else {
      fprintf(_stderr,"Trying to send TITLE: %s BODY: %s to %s\n",subject,body,dest);
    }
LAB_00112a39:
    std::operator+(&local_50,fLS::FLAGS_logmailer_abi_cxx11_," -s");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,subject,&local_131);
    ShellEscape(&local_70,&local_90);
    std::operator+(&local_110,&local_50,&local_70);
    std::operator+(&local_130,&local_110," ");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,dest,&local_132);
    ShellEscape(&local_b0,&local_d0);
    std::operator+(&cmd,&local_130,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    if (3 < *SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__) {
      if (SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__ ==
          &kLogSiteUninitialized) {
        bVar1 = InitVLOG3__(&SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__,
                            &fLI::FLAGS_v,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                            ,4);
        if (!bVar1) goto LAB_00112bb7;
      }
      LogMessage::LogMessage
                ((LogMessage *)&local_130,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                 ,0x72c);
      poVar3 = std::operator<<((ostream *)(local_130._M_string_length + 0x7538),"Mailing command: ")
      ;
      std::operator<<(poVar3,(string *)&cmd);
      LogMessage::~LogMessage((LogMessage *)&local_130);
    }
LAB_00112bb7:
    __s = popen(cmd._M_dataplus._M_p,"w");
    if (__s == (FILE *)0x0) {
      if (use_logging) {
        LogMessage::LogMessage
                  ((LogMessage *)&local_130,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                   ,0x740,2);
        poVar3 = std::operator<<((ostream *)(local_130._M_string_length + 0x7538),
                                 "Unable to send mail to ");
        std::operator<<(poVar3,dest);
        LogMessage::~LogMessage((LogMessage *)&local_130);
      }
      else {
        fprintf(_stderr,"Unable to send mail to %s\n",dest);
      }
    }
    else {
      if (body != (char *)0x0) {
        __n = strlen(body);
        fwrite(body,1,__n,__s);
      }
      iVar2 = pclose(__s);
      __stream = _stderr;
      body = (char *)0x1;
      if (iVar2 == -1) {
        if (use_logging) {
          LogMessage::LogMessage
                    ((LogMessage *)&local_110,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                     ,0x736,2);
          poVar3 = std::operator<<((ostream *)(local_110._M_string_length + 0x7538),
                                   "Problems sending mail to ");
          poVar3 = std::operator<<(poVar3,dest);
          poVar3 = std::operator<<(poVar3,": ");
          puVar4 = (uint *)__errno_location();
          StrError_abi_cxx11_(&local_130,(google *)(ulong)*puVar4,err);
          std::operator<<(poVar3,(string *)&local_130);
          std::__cxx11::string::~string((string *)&local_130);
          LogMessage::~LogMessage((LogMessage *)&local_110);
          body = (char *)0x0;
        }
        else {
          puVar4 = (uint *)__errno_location();
          StrError_abi_cxx11_(&local_130,(google *)(ulong)*puVar4,err_00);
          body = (char *)0x0;
          fprintf(__stream,"Problems sending mail to %s: %s\n",dest,local_130._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_130);
        }
      }
    }
    bVar5 = (byte)body;
    std::__cxx11::string::~string((string *)&cmd);
    if (__s != (FILE *)0x0) goto LAB_00112cf1;
  }
  bVar5 = 0;
LAB_00112cf1:
  return (bool)(bVar5 & 1);
}

Assistant:

static bool SendEmailInternal(const char*dest, const char *subject,
                              const char*body, bool use_logging) {
  if (dest && *dest) {
    if ( use_logging ) {
      VLOG(1) << "Trying to send TITLE:" << subject
              << " BODY:" << body << " to " << dest;
    } else {
      fprintf(stderr, "Trying to send TITLE: %s BODY: %s to %s\n",
              subject, body, dest);
    }

    string cmd =
        FLAGS_logmailer + " -s" +
        ShellEscape(subject) + " " + ShellEscape(dest);
    VLOG(4) << "Mailing command: " << cmd;

    FILE* pipe = popen(cmd.c_str(), "w");
    if (pipe != NULL) {
      // Add the body if we have one
      if (body)
        fwrite(body, sizeof(char), strlen(body), pipe);
      bool ok = pclose(pipe) != -1;
      if ( !ok ) {
        if ( use_logging ) {
          LOG(ERROR) << "Problems sending mail to " << dest << ": "
                     << StrError(errno);
        } else {
          fprintf(stderr, "Problems sending mail to %s: %s\n",
                  dest, StrError(errno).c_str());
        }
      }
      return ok;
    } else {
      if ( use_logging ) {
        LOG(ERROR) << "Unable to send mail to " << dest;
      } else {
        fprintf(stderr, "Unable to send mail to %s\n", dest);
      }
    }
  }
  return false;
}